

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall PlanningUnitMADPDiscrete::InitializeActionHistories(PlanningUnitMADPDiscrete *this)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  iterator __position;
  pointer puVar3;
  iterator __position_00;
  undefined1 auVar4 [16];
  int iVar5;
  undefined4 extraout_var;
  value_type *__x;
  undefined4 extraout_var_00;
  undefined8 uVar6;
  ulong uVar7;
  Index i;
  ulong uVar8;
  undefined1 auVar9 [64];
  undefined1 in_XMM2 [16];
  ActionHistoryTree *treeThiAg;
  size_t total;
  size_t oh_this_t;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> firstAHindex_per_t;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  unsigned_long local_78;
  vector<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>> *local_70;
  vector<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>,std::allocator<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
  *local_68;
  vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
  *local_60;
  vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
  *local_58;
  unsigned_long local_50;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_48;
  undefined1 extraout_var_01 [56];
  
  if ((this->_m_params)._m_individualActionHistories == true) {
    iVar5 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])(this);
    if (CONCAT44(extraout_var,iVar5) != 0) {
      local_58 = &this->_m_actionHistoryTreeVectors;
      local_60 = (vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  *)&this->_m_nrActionHistoriesT;
      local_68 = (vector<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>,std::allocator<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
                  *)&this->_m_firstAHIforT;
      local_70 = (vector<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>> *)
                 &this->_m_actionHistoryTreeRootPointers;
      uVar8 = 0;
      do {
        __x = (value_type *)operator_new(0x18);
        (__x->
        super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__x->
        super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__x->
        super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
        ::push_back(local_58,__x);
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
        ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>(local_60,&local_98)
        ;
        if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>,std::allocator<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
        ::emplace_back<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>
                  (local_68,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                            &local_98);
        if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        ppTVar2 = (__x->
                  super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (ppTVar2 != (pointer)0x0) {
          operator_delete(ppTVar2,(long)(__x->
                                        super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
                                        )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)ppTVar2);
        }
        operator_delete(__x,0x18);
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)CreateActionHistoryTree(this,(Index)uVar8);
        __position._M_current =
             (this->_m_actionHistoryTreeRootPointers).
             super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_m_actionHistoryTreeRootPointers).
            super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>>::
          _M_realloc_insert<TreeNode<ActionHistory>*const&>
                    (local_70,__position,(TreeNode<ActionHistory> **)&local_98);
        }
        else {
          *__position._M_current =
               (TreeNode<ActionHistory> *)
               local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          pppTVar1 = &(this->_m_actionHistoryTreeRootPointers).
                      super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
        uVar8 = (ulong)((Index)uVar8 + 1);
      } while (uVar8 < CONCAT44(extraout_var,iVar5));
    }
  }
  else {
    puVar3 = (this->_m_nrActionHistories).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->_m_nrActionHistories).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (this->_m_nrActionHistories).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
    local_70 = (vector<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>> *)
               &this->_m_nrActionHistories;
    local_68 = (vector<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>,std::allocator<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
                *)&this->_m_nrActionHistoriesT;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::_M_erase_at_end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)local_68,
                      (this->_m_nrActionHistoriesT).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    local_60 = (vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                *)&this->_m_firstAHIforT;
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::_M_erase_at_end((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                       *)local_60,
                      (this->_m_firstAHIforT).
                      super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    uVar8 = 0;
    local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long_long *)0x0;
    local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long_long *)0x0;
    local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long_long *)0x0;
    local_78 = 0;
    while( true ) {
      iVar5 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])(this);
      if (CONCAT44(extraout_var_00,iVar5) <= uVar8) break;
      uVar6 = (**(code **)((long)*this->_m_madp + 0x60))(this->_m_madp,uVar8);
      if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      local_78 = 0;
      if ((this->super_PlanningUnit)._m_horizon != 0) {
        auVar4 = vcvtusi2sd_avx512f(in_XMM2,uVar6);
        local_58 = auVar4._0_8_;
        uVar7 = 0;
        do {
          local_50 = local_78;
          if (local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
            _M_realloc_insert<unsigned_long_long>
                      (&local_48,
                       (iterator)
                       local_48.
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_50);
          }
          else {
            *local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_78;
            local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_48.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          auVar4 = vcvtusi2sd_avx512f(in_XMM2,(int)uVar7);
          auVar9._0_8_ = pow((double)local_58,auVar4._0_8_);
          auVar9._8_56_ = extraout_var_01;
          local_50 = vcvttsd2usi_avx512f(auVar9._0_16_);
          if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,
                       (iterator)
                       local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_50);
          }
          else {
            *local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_50;
            local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_78 = local_78 + local_50;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (uVar7 < (this->super_PlanningUnit)._m_horizon);
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   *)local_60,&local_48);
      __position_00._M_current =
           (this->_m_nrActionHistories).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->_m_nrActionHistories).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_70,__position_00,
                   &local_78);
      }
      else {
        *__position_00._M_current = local_78;
        (this->_m_nrActionHistories).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)local_68,&local_98);
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    if (local_48.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
        .super__Vector_impl_data._M_start != (unsigned_long_long *)0x0) {
      operator_delete(local_48.
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void PlanningUnitMADPDiscrete::InitializeActionHistories()
{
    if(_m_params.GetComputeIndividualActionHistories())
    {
        size_t nrAgents=GetNrAgents();
        for(Index i = 0; i < nrAgents; i++)
        {
            vector<ActionHistoryTree*> * temp = new 
                vector<ActionHistoryTree*>;
            _m_actionHistoryTreeVectors.push_back(* temp );
            _m_nrActionHistoriesT.push_back(vector<size_t>());
            _m_firstAHIforT.push_back(vector<LIndex>());
            delete temp; // temp is copied into the vector - so delete this imm.
            ActionHistoryTree* treeThiAg = CreateActionHistoryTree(i);
            _m_actionHistoryTreeRootPointers.push_back(treeThiAg);
        }
    }
    else
    {
        /*Calculates the number of individual action histories and
         * stores this in _m_nrActionHistories (and 
         * _m_nrActionHistoriesT).
         * Only used when the Action histories are not created.
         */
        _m_nrActionHistories.clear();
        _m_nrActionHistoriesT.clear();
        _m_firstAHIforT.clear();
        vector<size_t> oh_per_t;
        vector<LIndex> firstAHindex_per_t;
        size_t total = 0;
        for(Index i=0; i < GetNrAgents(); i++)
        {
            size_t nrAi = GetMADPDI()->GetNrActions(i);
            oh_per_t.clear();
            firstAHindex_per_t.clear();
            total = 0;
            for(Index t=0; t < GetHorizon(); t++)
            {
                firstAHindex_per_t.push_back(total);
                size_t oh_this_t = (size_t) pow( (double)nrAi, (double)t );
                oh_per_t.push_back(oh_this_t);
                total += oh_this_t;
            }
            _m_firstAHIforT.push_back(firstAHindex_per_t);
            _m_nrActionHistories.push_back(total);
            _m_nrActionHistoriesT.push_back(oh_per_t);
        }
    }
}